

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_match_time.c
# Opt level: O0

void test_older_mtime_than_file_mbs(void)

{
  wchar_t wVar1;
  int iVar2;
  archive *_a;
  archive_entry *entry;
  archive *_a_00;
  archive *m;
  archive_entry *ae;
  archive *a;
  
  _a = archive_match_new();
  wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_time.c"
                           ,L'ˡ',(uint)(_a != (archive *)0x0),"(m = archive_match_new()) != NULL",
                           (void *)0x0);
  if (wVar1 != L'\0') {
    entry = archive_entry_new();
    wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_time.c"
                             ,L'ˣ',(uint)(entry != (archive_entry *)0x0),
                             "(ae = archive_entry_new()) != NULL",(void *)0x0);
    if (wVar1 == L'\0') {
      archive_match_free(_a);
    }
    else {
      _a_00 = archive_read_disk_new();
      wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_time.c"
                               ,L'˧',(uint)(_a_00 != (archive *)0x0),
                               "(a = archive_read_disk_new()) != NULL",(void *)0x0);
      if (wVar1 == L'\0') {
        archive_match_free(_a);
        archive_entry_free(entry);
      }
      else {
        wVar1 = archive_match_include_file_time(_a,L'Ă',"mid_mtime");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_time.c"
                            ,L'˱',0,"0",(long)wVar1,
                            "archive_match_include_file_time(m, ARCHIVE_MATCH_MTIME | ARCHIVE_MATCH_OLDER, \"mid_mtime\")"
                            ,_a);
        archive_entry_copy_pathname(entry,"old_mtime");
        iVar2 = archive_read_disk_entry_from_file(_a_00,entry,-1,(stat_conflict *)0x0);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_time.c"
                            ,L'˶',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_read_disk_entry_from_file(a, ae, -1, NULL)",_a_00);
        failure("old_mtime should not be excluded");
        wVar1 = archive_match_time_excluded(_a,entry);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_time.c"
                            ,L'˸',0,"0",(long)wVar1,"archive_match_time_excluded(m, ae)",
                            (void *)0x0);
        wVar1 = archive_match_excluded(_a,entry);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_time.c"
                            ,L'˹',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
        archive_entry_clear(entry);
        archive_entry_copy_pathname(entry,"mid_mtime");
        iVar2 = archive_read_disk_entry_from_file(_a_00,entry,-1,(stat_conflict *)0x0);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_time.c"
                            ,L'˿',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_read_disk_entry_from_file(a, ae, -1, NULL)",_a_00);
        failure("mid_mtime should be excluded");
        wVar1 = archive_match_time_excluded(_a,entry);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_time.c"
                            ,L'́',1,"1",(long)wVar1,"archive_match_time_excluded(m, ae)",
                            (void *)0x0);
        wVar1 = archive_match_excluded(_a,entry);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_time.c"
                            ,L'̂',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
        archive_entry_clear(entry);
        archive_entry_copy_pathname(entry,"new_mtime");
        iVar2 = archive_read_disk_entry_from_file(_a_00,entry,-1,(stat_conflict *)0x0);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_time.c"
                            ,L'̈',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_read_disk_entry_from_file(a, ae, -1, NULL)",_a_00);
        failure("new_mtime should be excluded");
        wVar1 = archive_match_time_excluded(_a,entry);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_time.c"
                            ,L'̊',1,"1",(long)wVar1,"archive_match_time_excluded(m, ae)",
                            (void *)0x0);
        wVar1 = archive_match_excluded(_a,entry);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_time.c"
                            ,L'̋',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
        archive_read_free(_a_00);
        archive_entry_free(entry);
        archive_match_free(_a);
      }
    }
  }
  return;
}

Assistant:

static void
test_older_mtime_than_file_mbs(void)
{
	struct archive *a;
	struct archive_entry *ae;
	struct archive *m;

	if (!assert((m = archive_match_new()) != NULL))
		return;
	if (!assert((ae = archive_entry_new()) != NULL)) {
		archive_match_free(m);
		return;
	}
	if (!assert((a = archive_read_disk_new()) != NULL)) {
		archive_match_free(m);
		archive_entry_free(ae);
		return;
	}

	/*
	 * Test: older mtime than a file specified in MBS file name.
	 */
	assertEqualIntA(m, 0, archive_match_include_file_time(m,
	    ARCHIVE_MATCH_MTIME | ARCHIVE_MATCH_OLDER, "mid_mtime"));

	/* Verify 'old_mtime' file. */
	archive_entry_copy_pathname(ae, "old_mtime");
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_disk_entry_from_file(a, ae, -1, NULL));
	failure("old_mtime should not be excluded");
	assertEqualInt(0, archive_match_time_excluded(m, ae));
	assertEqualInt(0, archive_match_excluded(m, ae));

	/* Verify 'mid_mtime' file. */
	archive_entry_clear(ae);
	archive_entry_copy_pathname(ae, "mid_mtime");
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_disk_entry_from_file(a, ae, -1, NULL));
	failure("mid_mtime should be excluded");
	assertEqualInt(1, archive_match_time_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));

	/* Verify 'new_mtime' file. */
	archive_entry_clear(ae);
	archive_entry_copy_pathname(ae, "new_mtime");
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_disk_entry_from_file(a, ae, -1, NULL));
	failure("new_mtime should be excluded");
	assertEqualInt(1, archive_match_time_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));

	/* Clean up. */
	archive_read_free(a);
	archive_entry_free(ae);
	archive_match_free(m);
}